

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall t_swift_generator::generate_enum(t_swift_generator *this,t_enum *tenum)

{
  ofstream_with_content_based_conditional_update *out;
  int *piVar1;
  t_swift_generator *ptVar2;
  t_enum *ptVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pptVar6;
  string local_98;
  t_swift_generator *local_78;
  t_enum *local_70;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_50;
  
  if (this->gen_cocoa_ == true) {
    generate_old_enum(this,tenum);
    return;
  }
  out = &this->f_decl_;
  local_70 = tenum;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  ptVar3 = local_70;
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"public enum ");
  iVar4 = (*(ptVar3->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar3);
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar4));
  std::operator<<(poVar5," : TEnum");
  std::__cxx11::string::~string((string *)&local_98);
  local_78 = this;
  block_open(this,(ostream *)out);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            (&constants,&ptVar3->constants_);
  for (pptVar6 = constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ptVar2 = local_78,
      pptVar6 !=
      constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)local_78);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
    poVar5 = std::operator<<(poVar5,"case ");
    enum_case_name_abi_cxx11_(&local_50,local_78,*pptVar6,true);
    poVar5 = std::operator<<(poVar5,(string *)&local_50);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if (local_78->safe_enums_ == true) {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)local_78);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
    poVar5 = std::operator<<(poVar5,"case unknown(Int32)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"public static func read(from proto: TProtocol) throws -> ");
  iVar4 = (*(local_70->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator<<(poVar5,(string *)CONCAT44(extraout_var_00,iVar4));
  std::__cxx11::string::~string((string *)&local_98);
  block_open(ptVar2,(ostream *)out);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"let raw: Int32 = try proto.read()");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"let new = ");
  iVar4 = (*(local_70->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_01,iVar4));
  poVar5 = std::operator<<(poVar5,"(rawValue: raw)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"if let unwrapped = new {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  piVar1 = &(ptVar2->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"return unwrapped");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  piVar1 = &(ptVar2->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"} else {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  piVar1 = &(ptVar2->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"throw TProtocolError(error: .invalidData,");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,
                           "                     message: \"Invalid enum value (\\(raw)) for \\(");
  iVar4 = (*(local_70->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_02,iVar4));
  poVar5 = std::operator<<(poVar5,".self)\")");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  piVar1 = &(ptVar2->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  block_close(ptVar2,(ostream *)out,true);
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  std::operator<<(poVar5,"public init()");
  std::__cxx11::string::~string((string *)&local_98);
  block_open(ptVar2,(ostream *)out);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"self = .");
  enum_case_name_abi_cxx11_
            (&local_50,ptVar2,
             *constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_start,false);
  poVar5 = std::operator<<(poVar5,(string *)&local_50);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98);
  block_close(ptVar2,(ostream *)out,true);
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  std::operator<<(poVar5,"public var rawValue: Int32");
  std::__cxx11::string::~string((string *)&local_98);
  block_open(ptVar2,(ostream *)out);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"switch self {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  for (pptVar6 = constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ptVar2 = local_78,
      pptVar6 !=
      constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)local_78);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
    poVar5 = std::operator<<(poVar5,"case .");
    enum_case_name_abi_cxx11_(&local_50,local_78,*pptVar6,true);
    poVar5 = std::operator<<(poVar5,(string *)&local_50);
    poVar5 = std::operator<<(poVar5,": return ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*pptVar6)->value_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if (local_78->safe_enums_ == true) {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)local_78);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
    poVar5 = std::operator<<(poVar5,"case .unknown(let value): return value");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
  }
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  block_close(ptVar2,(ostream *)out,true);
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  std::operator<<(poVar5,"public init?(rawValue: Int32)");
  std::__cxx11::string::~string((string *)&local_98);
  block_open(ptVar2,(ostream *)out);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"switch rawValue {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  for (pptVar6 = constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ptVar2 = local_78,
      pptVar6 !=
      constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)local_78);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
    poVar5 = std::operator<<(poVar5,"case ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*pptVar6)->value_);
    poVar5 = std::operator<<(poVar5,": self = .");
    enum_case_name_abi_cxx11_(&local_50,local_78,*pptVar6,true);
    poVar5 = std::operator<<(poVar5,(string *)&local_50);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if (local_78->safe_enums_ == false) {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)local_78);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
    poVar5 = std::operator<<(poVar5,"default: return nil");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)local_78);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
    poVar5 = std::operator<<(poVar5,"default: self = .unknown(rawValue)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_98);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)ptVar2);
  poVar5 = std::operator<<((ostream *)out,(string *)&local_98);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  block_close(ptVar2,(ostream *)out,true);
  block_close(ptVar2,(ostream *)out,true);
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~_Vector_base
            (&constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>);
  return;
}

Assistant:

void t_swift_generator::generate_enum(t_enum* tenum) {
  if (gen_cocoa_) {
    generate_old_enum(tenum);
    return;
  }
  f_decl_ << indent() << "public enum " << tenum->get_name() << " : TEnum";
  block_open(f_decl_);

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;

  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case " << enum_case_name((*c_iter), true) << endl;
  }

  // unknown associated value case for safety and similar behavior to other languages
  if (safe_enums_) {
    f_decl_ << indent() << "case unknown(Int32)" << endl;
  }
  f_decl_ << endl;

  // TSerializable read(from:)
  f_decl_ << indent() << "public static func read(from proto: TProtocol) throws -> "
          << tenum->get_name();
  block_open(f_decl_);
  f_decl_ << indent() << "let raw: Int32 = try proto.read()" << endl;
  f_decl_ << indent() << "let new = " << tenum->get_name() << "(rawValue: raw)" << endl;

  f_decl_ << indent() << "if let unwrapped = new {" << endl;
  indent_up();
  f_decl_ << indent() << "return unwrapped" << endl;
  indent_down();
  f_decl_ << indent() << "} else {" << endl;
  indent_up();
  f_decl_ << indent() << "throw TProtocolError(error: .invalidData," << endl;
  f_decl_ << indent() << "                     message: \"Invalid enum value (\\(raw)) for \\("
          << tenum->get_name() << ".self)\")" << endl;
  indent_down();
  f_decl_ << indent() << "}" << endl;
  block_close(f_decl_);

  // empty init for TSerializable
  f_decl_ << endl;
  f_decl_ << indent() << "public init()";
  block_open(f_decl_);

  f_decl_ << indent() << "self = ." << enum_case_name(constants.front(), false) << endl;
  block_close(f_decl_);
  f_decl_ << endl;

  // rawValue getter
  f_decl_ << indent() << "public var rawValue: Int32";
  block_open(f_decl_);
  f_decl_ << indent() << "switch self {" << endl;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case ." << enum_case_name((*c_iter), true)
            << ": return " << (*c_iter)->get_value() << endl;
  }
  if (safe_enums_) {
    f_decl_ << indent() << "case .unknown(let value): return value" << endl;
  }
  f_decl_ << indent() << "}" << endl;
  block_close(f_decl_);
  f_decl_ << endl;

  // convenience rawValue initalizer
  f_decl_ << indent() << "public init?(rawValue: Int32)";
  block_open(f_decl_);
  f_decl_ << indent() << "switch rawValue {" << endl;;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case " << (*c_iter)->get_value()
            << ": self = ." << enum_case_name((*c_iter), true) << endl;
  }
  if (!safe_enums_) {
    f_decl_ << indent() << "default: return nil" << endl;
  } else {
    f_decl_ << indent() << "default: self = .unknown(rawValue)" << endl;
  }
  f_decl_ << indent() << "}" << endl;
  block_close(f_decl_);




  block_close(f_decl_);
  f_decl_ << endl;
}